

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void AddErrorLocationInfo(char *codeStart,char *errorPos,char *errorBuf,uint errorBufSize)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  byte *pbVar6;
  byte bVar7;
  ulong size;
  char *dst;
  byte *pbVar8;
  byte *pbVar9;
  int iVar10;
  byte *pbVar11;
  bool bVar12;
  
  if (errorBufSize == 0 || errorBuf == (char *)0x0) {
    return;
  }
  sVar4 = strlen(errorBuf);
  dst = errorBuf + sVar4;
  if (codeStart != (char *)0x0 && errorPos != (char *)0x0) {
    sVar5 = strlen(codeStart);
    if (errorPos <= codeStart + sVar5 && codeStart <= errorPos) {
      pbVar9 = (byte *)(errorPos + (codeStart + sVar5 != errorPos));
      pbVar6 = (byte *)errorPos;
      while (pbVar8 = pbVar6, pbVar11 = (byte *)codeStart, codeStart < pbVar8) {
        pbVar11 = pbVar8;
        if ((pbVar8[-1] == 0xd) || (pbVar6 = pbVar8 + -1, pbVar8[-1] == 10)) break;
      }
      while ((0xd < *pbVar9 || ((0x2401U >> (*pbVar9 & 0x1f) & 1) == 0))) {
        pbVar9 = pbVar9 + 1;
      }
      if ((uint)sVar4 < errorBufSize) {
        *dst = '\n';
        dst = dst + 1;
      }
      uVar1 = GetErrorLocationLineNumber(codeStart,errorPos);
      iVar10 = (int)errorBuf;
      size = (ulong)((iVar10 - (int)dst) + errorBufSize);
      if (uVar1 == 0) {
        iVar2 = NULLC::SafeSprintf(dst,size,"  at \'");
      }
      else {
        iVar2 = NULLC::SafeSprintf(dst,size,"  at line %d: \'",(ulong)uVar1);
      }
      pbVar8 = (byte *)(dst + iVar2);
      for (pbVar6 = pbVar11; (pbVar6 < pbVar9 && (bVar7 = *pbVar6, bVar7 != 0)); pbVar6 = pbVar6 + 1
          ) {
        if ((uint)((int)pbVar8 - iVar10) < errorBufSize) {
          if (bVar7 == 9) {
            bVar7 = 0x20;
          }
          *pbVar8 = bVar7;
          pbVar8 = pbVar8 + 1;
        }
      }
      iVar3 = NULLC::SafeSprintf((char *)pbVar8,(ulong)((iVar10 - (int)pbVar8) + errorBufSize),
                                 "\'\n");
      pbVar8 = pbVar8 + iVar3;
      iVar2 = iVar2 + ((int)errorPos - (int)pbVar11);
      while( true ) {
        bVar12 = iVar2 == 0;
        iVar2 = iVar2 + -1;
        if (bVar12) break;
        if ((uint)((int)pbVar8 - iVar10) < errorBufSize) {
          *pbVar8 = 0x20;
          pbVar8 = pbVar8 + 1;
        }
      }
      NULLC::SafeSprintf((char *)pbVar8,(ulong)((iVar10 - (int)pbVar8) + errorBufSize),"^\n");
      errorBuf[errorBufSize - 1] = '\0';
      return;
    }
  }
  NULLC::SafeSprintf(dst,(ulong)(errorBufSize - (uint)sVar4),"\n");
  return;
}

Assistant:

void AddErrorLocationInfo(const char *codeStart, const char *errorPos, char *errorBuf, unsigned errorBufSize)
{
	if(!errorBuf || !errorBufSize)
		return;

	char *errorCurr = errorBuf + strlen(errorBuf);

	if(!codeStart || !errorPos)
	{
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "\n");
		return;
	}

	const char *codeEnd = codeStart + strlen(codeStart);

	if(errorPos < codeStart || errorPos > codeEnd)
	{
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "\n");
		return;
	}

	const char *start = errorPos;
	const char *end = start == codeEnd ? start : start + 1;

	while(start > codeStart && *(start - 1) != '\r' && *(start - 1) != '\n')
		start--;

	while(*end && *end != '\r' && *end != '\n')
		end++;

	if(errorBufSize > unsigned(errorCurr - errorBuf))
		*(errorCurr++) = '\n';

	char *errorCurrBefore = errorCurr;

	if(unsigned line = GetErrorLocationLineNumber(codeStart, errorPos))
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "  at line %d: '", line);
	else
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "  at '");

	unsigned spacing = unsigned(errorCurr - errorCurrBefore);

	for(const char *pos = start; *pos && pos < end; pos++)
	{
		if(errorBufSize > unsigned(errorCurr - errorBuf))
			*(errorCurr++) = *pos == '\t' ? ' ' : *pos;
	}

	errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "'\n");

	for(unsigned i = 0; i < spacing + unsigned(errorPos - start); i++)
	{
		if(errorBufSize > unsigned(errorCurr - errorBuf))
			*(errorCurr++) = ' ';
	}

	errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "^\n");

	errorBuf[errorBufSize - 1] = '\0';
}